

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableView::setSelectionModel(QTableView *this,QItemSelectionModel *selectionModel)

{
  QPointer *this_00;
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  offset_in_QItemSelectionModel_to_subr signal;
  long in_FS_OFFSET;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  this_00 = (QPointer *)(lVar1 + 800);
  bVar3 = QPointer::operator_cast_to_bool(this_00);
  if (bVar3) {
    QObject::disconnect((Connection *)(lVar1 + 0x5a0));
  }
  (**(code **)(**(long **)(lVar1 + 0x588) + 0x1d0))(*(long **)(lVar1 + 0x588),selectionModel);
  (**(code **)(**(long **)(lVar1 + 0x580) + 0x1d0))(*(long **)(lVar1 + 0x580),selectionModel);
  QAbstractItemView::setSelectionModel((QAbstractItemView *)this,selectionModel);
  bVar3 = QPointer::operator_cast_to_bool(this_00);
  if (bVar3) {
    if ((*(long *)this_00 == 0) || (*(int *)(*(long *)this_00 + 4) == 0)) {
      signal = 0;
    }
    else {
      signal = *(offset_in_QItemSelectionModel_to_subr *)(lVar1 + 0x328);
    }
    QObject::
    connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),bool(QAbstractItemModel::*)()>
              ((Object *)&local_30,signal,(ContextType *)QItemSelectionModel::currentRowChanged,
               (offset_in_QAbstractItemModel_to_subr *)0x0,
               (ConnectionType)*(undefined8 *)(lVar1 + 0x2f8));
    uVar2 = *(undefined8 *)(lVar1 + 0x5a0);
    *(undefined8 *)(lVar1 + 0x5a0) = local_30;
    local_30 = uVar2;
    QMetaObject::Connection::~Connection((Connection *)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::setSelectionModel(QItemSelectionModel *selectionModel)
{
    Q_D(QTableView);
    Q_ASSERT(selectionModel);
    if (d->selectionModel) {
        // support row editing
        disconnect(d->selectionmodelConnection);
    }

    d->verticalHeader->setSelectionModel(selectionModel);
    d->horizontalHeader->setSelectionModel(selectionModel);
    QAbstractItemView::setSelectionModel(selectionModel);

    if (d->selectionModel) {
        // support row editing
        d->selectionmodelConnection =
            connect(d->selectionModel, &QItemSelectionModel::currentRowChanged,
                    d->model, &QAbstractItemModel::submit);
    }
}